

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O3

int __thiscall Opt::parse_options(Opt *this,char **argv,int *i,bool *options_parsing)

{
  int i_00;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  byte bVar4;
  
  bVar4 = *options_parsing;
  if ((bool)bVar4 == true) {
    bVar2 = parse_flag(this,argv,*i,"-v","--verbose");
    if ((bVar2) || (bVar2 = parse_flag(this,argv,*i,"-v","--log-verbose"), bVar2)) {
      this->verbose = true;
      return 0;
    }
    bVar4 = *options_parsing;
  }
  if ((bVar4 & 1) != 0) {
    i_00 = *i;
    iVar3 = strcmp(argv[i_00],"--jinja");
    if (iVar3 == 0) {
      this->use_jinja = true;
      return 0;
    }
    bVar2 = parse_flag(this,argv,i_00,"-h","--help");
    if (bVar2) {
      this->help = true;
      return 0;
    }
    bVar4 = *options_parsing;
  }
  if ((bVar4 & 1) == 0) {
    return 2;
  }
  pcVar1 = argv[*i];
  if (*pcVar1 == '-') {
    if (pcVar1[1] != '-') {
      return 2;
    }
    if (pcVar1[2] == '\0') {
      *options_parsing = false;
      return 0;
    }
    return 2;
  }
  return 2;
}

Assistant:

int parse_options(const char ** argv, int & i, bool & options_parsing) {
        if (options_parsing && (parse_flag(argv, i, "-v", "--verbose") || parse_flag(argv, i, "-v", "--log-verbose"))) {
            verbose = true;
        } else if (options_parsing && strcmp(argv[i], "--jinja") == 0) {
            use_jinja = true;
        } else if (options_parsing && parse_flag(argv, i, "-h", "--help")) {
            help = true;
            return 0;
        } else if (options_parsing && strcmp(argv[i], "--") == 0) {
            options_parsing = false;
        } else {
            return 2;
        }

        return 0;
    }